

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Fire_PDU::Fire_PDU(Fire_PDU *this)

{
  MunitionDescriptor *this_00;
  DescPtr local_48;
  
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_00222da0;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Location);
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00222d70;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x02';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x60;
  this_00 = (MunitionDescriptor *)operator_new(0x20);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(this_00);
  local_48._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00222d70;
  local_48.m_pRef = (Descriptor *)this_00;
  local_48.m_piCount = (RefCounter *)operator_new(2);
  *local_48.m_piCount = 1;
  SetDescriptor(this,&local_48);
  local_48._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00222d70;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::unRef(&local_48);
  return;
}

Assistant:

Fire_PDU::Fire_PDU()
{
    m_ui8PDUType = Fire_PDU_Type;
    m_ui16PDULength = FIRE_PDU_SIZE;
    SetDescriptor( DescPtr( new MunitionDescriptor() ) );
}